

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O1

void __thiscall TApp_FileExists_Test::TestBody(TApp_FileExists_Test *this)

{
  App *this_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  Option *pOVar4;
  long *plVar5;
  long lVar6;
  char *pcVar7;
  char *in_R9;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  string filename;
  string myfile;
  stat buffer;
  AssertHelper local_310;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  AssertHelper local_300;
  undefined1 local_2f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_298;
  string local_270;
  string local_250;
  undefined1 local_230 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  long local_220 [2];
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined1 local_1f0 [184];
  ios_base local_138 [264];
  
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"TestNonFileNotUsed.txt","");
  iVar3 = stat(local_2b8._M_dataplus._M_p,(stat *)local_230);
  if (iVar3 == 0) {
    if ((local_220[1]._1_1_ & 0x40) != 0) {
      pcVar7 = "File is actually a directory: ";
      goto LAB_001290ed;
    }
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    local_2d8._M_string_length = 0;
    local_2d8.field_2._M_local_buf[0] = '\0';
  }
  else {
    pcVar7 = "File does not exist: ";
LAB_001290ed:
    std::operator+(&local_2d8,pcVar7,&local_2b8);
  }
  local_2f8[0] = (internal)(local_2d8._M_string_length != 0);
  local_2f8._8_8_ = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if (local_2f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_230,(internal *)local_2f8,
               (AssertionResult *)"CLI::ExistingFile(myfile).empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x303,(char *)local_230);
    testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    if (local_230 != (undefined1  [8])local_220) {
      operator_delete((void *)local_230);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_2d8._M_dataplus._M_p + 8))();
      }
      local_2d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Failed","");
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"--file","");
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"","");
  this_00 = &(this->super_TApp).app;
  pOVar4 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (this_00,&local_250,&local_2d8,&local_270);
  local_298.super__Function_base._M_functor._8_8_ = 0;
  local_298.super__Function_base._M_functor._M_unused._M_object = CLI::ExistingFile;
  local_298._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_298.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  std::
  vector<std::function<std::__cxx11::string(std::__cxx11::string&)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string&)>>>
  ::emplace_back<std::function<std::__cxx11::string(std::__cxx11::string_const&)>&>
            ((vector<std::function<std::__cxx11::string(std::__cxx11::string&)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string&)>>>
              *)&pOVar4->validators_,&local_298);
  if (local_298.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_298.super__Function_base._M_manager)
              ((_Any_data *)&local_298,(_Any_data *)&local_298,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  local_230 = (undefined1  [8])local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"--file","");
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_210,local_2b8._M_dataplus._M_p,
             local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,local_230,local_1f0);
  lVar6 = 0;
  do {
    if (local_200 + lVar6 != *(undefined1 **)((long)local_210 + lVar6)) {
      operator_delete(*(undefined1 **)((long)local_210 + lVar6));
    }
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x40);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_230);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_2f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x309,
             "Expected: run() throws an exception of type CLI::ValidationError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_2f8,(Message *)local_230);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2f8);
  if (local_230 != (undefined1  [8])0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && (local_230 != (undefined1  [8])0x0)) {
      (**(code **)(*(long *)local_230 + 8))();
    }
    local_230 = (undefined1  [8])0x0;
  }
  CLI::App::reset(this_00);
  std::ofstream::ofstream(local_230,local_2b8._M_dataplus._M_p,_S_out);
  plVar5 = (long *)std::ostream::put((char)local_230);
  bVar1 = *(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20);
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + _VTT[-3]) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  bVar2 = (bVar1 & 5) == 0;
  local_2f8[0] = (internal)bVar2;
  local_2f8._8_8_ = 0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_230,(internal *)local_2f8,(AssertionResult *)"ok","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x30e,(char *)local_230);
    testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    if (local_230 != (undefined1  [8])local_220) {
      operator_delete((void *)local_230);
    }
    if (local_310.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_310.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_310.data_ + 8))();
      }
      local_310.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  TApp::run(&this->super_TApp);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_230,"myfile","filename",&local_2b8,&local_2d8);
  if (local_230[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2f8);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x310,pcVar7);
    testing::internal::AssertHelper::operator=(&local_310,(Message *)local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    if ((AssertHelperData *)local_2f8._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_2f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_2f8._0_8_ + 8))();
      }
      local_2f8._0_8_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  remove(local_2b8._M_dataplus._M_p);
  iVar3 = stat(local_2b8._M_dataplus._M_p,(stat *)local_230);
  if (iVar3 == 0) {
    if ((local_220[1]._1_1_ & 0x40) == 0) {
      local_2f8._0_8_ = local_2f8 + 0x10;
      local_2f8._8_8_ = 0;
      local_2f8[0x10] = '\0';
      goto LAB_001296a4;
    }
    pcVar7 = "File is actually a directory: ";
  }
  else {
    pcVar7 = "File does not exist: ";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
                 pcVar7,&local_2b8);
LAB_001296a4:
  local_310.data_._0_1_ = (internal)(local_2f8._8_8_ != 0);
  local_308.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((AssertHelperData *)local_2f8._0_8_ != (AssertHelperData *)(local_2f8 + 0x10)) {
    operator_delete((void *)local_2f8._0_8_);
  }
  if (local_310.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_230,(internal *)&local_310,
               (AssertionResult *)"CLI::ExistingFile(myfile).empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x313,(char *)local_230);
    testing::internal::AssertHelper::operator=(&local_300,(Message *)local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    if (local_230 != (undefined1  [8])local_220) {
      operator_delete((void *)local_230);
    }
    if ((AssertHelperData *)local_2f8._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_2f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_2f8._0_8_ + 8))();
      }
      local_2f8._0_8_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_308,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(TApp, FileExists) {
    std::string myfile{"TestNonFileNotUsed.txt"};
    EXPECT_FALSE(CLI::ExistingFile(myfile).empty());

    std::string filename = "Failed";
    app.add_option("--file", filename)->check(CLI::ExistingFile);
    args = {"--file", myfile};

    EXPECT_THROW(run(), CLI::ValidationError);

    app.reset();

    bool ok = static_cast<bool>(std::ofstream(myfile.c_str()).put('a')); // create file
    EXPECT_TRUE(ok);
    run();
    EXPECT_EQ(myfile, filename);

    std::remove(myfile.c_str());
    EXPECT_FALSE(CLI::ExistingFile(myfile).empty());
}